

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

bool __thiscall
re2::TestInstance::RunCase(TestInstance *this,StringPiece *text,StringPiece *context,Anchor anchor)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  ostream *poVar4;
  iterator pcVar5;
  iterator pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  LogMessage local_c60;
  re2 local_ae0 [32];
  string local_ac0 [32];
  LogMessage local_aa0;
  re2 local_920 [32];
  re2 local_900 [32];
  string local_8e0 [32];
  LogMessage local_8c0;
  uint local_73c;
  undefined1 local_738 [4];
  int i_1;
  LogMessage local_5b8;
  undefined1 local_438 [8];
  Result r;
  Engine i;
  bool all_okay;
  re2 local_2f8 [48];
  LogMessage local_2c8;
  undefined1 local_148 [8];
  Result correct;
  Anchor anchor_local;
  StringPiece *context_local;
  StringPiece *text_local;
  TestInstance *this_local;
  
  correct.submatch[0x10]._12_4_ = anchor;
  Result::Result((Result *)local_148);
  RunSearch(this,kEngineBacktrack,text,context,correct.submatch[0x10]._12_4_,(Result *)local_148);
  if ((local_148[0] & 1U) == 0) {
    r.submatch[0x10]._15_1_ = 1;
    r.submatch[0x10].length_ = operator+(kEngineBacktrack,1);
    while (r.submatch[0x10].length_ < 10) {
      uVar3 = Engines();
      if ((uVar3 & 1 << ((byte)r.submatch[0x10].length_ & 0x1f)) != 0) {
        Result::Result((Result *)local_438);
        RunSearch(this,r.submatch[0x10].length_,text,context,correct.submatch[0x10]._12_4_,
                  (Result *)local_438);
        bVar2 = ResultOkay((Result *)local_438,(Result *)local_148);
        if (bVar2) {
          if ((FLAGS_log_okay & 1) != 0) {
            pcVar9 = "Okay: ";
            if ((local_438[0] & 1U) != 0) {
              pcVar9 = "Skipped: ";
            }
            LogMatch(this,pcVar9,r.submatch[0x10].length_,text,context,correct.submatch[0x10]._12_4_
                    );
          }
        }
        else if ((r.submatch[0x10].length_ != 9) || (bVar2 = NonASCII(text), !bVar2)) {
          if ((local_438[2] & 1U) == 0) {
            r.submatch[0x10]._15_1_ = 0;
          }
          pcVar9 = "Mismatch: ";
          if ((local_438[2] & 1U) != 0) {
            pcVar9 = "(Untrusted) Mismatch: ";
          }
          LogMatch(this,pcVar9,r.submatch[0x10].length_,text,context,correct.submatch[0x10]._12_4_);
          if ((local_438[1] & 1U) != (local_148[1] & 1U)) {
            if ((local_438[1] & 1U) == 0) {
              LogMessage::LogMessage
                        ((LogMessage *)local_738,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                         ,0x21a,0);
              poVar4 = LogMessage::stream((LogMessage *)local_738);
              std::operator<<(poVar4,"   Should match (but does not).");
              LogMessage::~LogMessage((LogMessage *)local_738);
              goto LAB_001539ba;
            }
            LogMessage::LogMessage
                      (&local_5b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                       ,0x218,0);
            poVar4 = LogMessage::stream(&local_5b8);
            std::operator<<(poVar4,"   Should not match (but does).");
            LogMessage::~LogMessage(&local_5b8);
          }
          for (local_73c = 0; (int)local_73c < this->num_captures_ + 1; local_73c = local_73c + 1) {
            pcVar5 = StringPiece::begin((StringPiece *)
                                        &r.submatch[(long)(int)local_73c + -1].length_);
            pcVar6 = StringPiece::begin((StringPiece *)
                                        &correct.submatch[(long)(int)local_73c + -1].length_);
            if (pcVar5 == pcVar6) {
              pcVar5 = StringPiece::end((StringPiece *)
                                        &r.submatch[(long)(int)local_73c + -1].length_);
              pcVar6 = StringPiece::end((StringPiece *)
                                        &correct.submatch[(long)(int)local_73c + -1].length_);
              if (pcVar5 != pcVar6) goto LAB_001536da;
              LogMessage::LogMessage
                        (&local_aa0,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                         ,0x227,0);
              poVar4 = LogMessage::stream(&local_aa0);
              uVar1 = local_73c;
              FormatCapture_abi_cxx11_
                        (local_ae0,text,
                         (StringPiece *)&r.submatch[(long)(int)local_73c + -1].length_);
              uVar7 = std::__cxx11::string::c_str();
              StringPrintf_abi_cxx11_((char *)local_ac0,"   $%d: %s ok",(ulong)uVar1,uVar7);
              std::operator<<(poVar4,local_ac0);
              std::__cxx11::string::~string(local_ac0);
              std::__cxx11::string::~string((string *)local_ae0);
              LogMessage::~LogMessage(&local_aa0);
            }
            else {
LAB_001536da:
              LogMessage::LogMessage
                        (&local_8c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                         ,0x221,0);
              poVar4 = LogMessage::stream(&local_8c0);
              uVar1 = local_73c;
              FormatCapture_abi_cxx11_
                        (local_900,text,
                         (StringPiece *)&correct.submatch[(long)(int)local_73c + -1].length_);
              uVar7 = std::__cxx11::string::c_str();
              FormatCapture_abi_cxx11_
                        (local_920,text,
                         (StringPiece *)&r.submatch[(long)(int)local_73c + -1].length_);
              uVar8 = std::__cxx11::string::c_str();
              StringPrintf_abi_cxx11_
                        ((char *)local_8e0,"   $%d: should be %s is %s",(ulong)uVar1,uVar7,uVar8);
              std::operator<<(poVar4,local_8e0);
              std::__cxx11::string::~string(local_8e0);
              std::__cxx11::string::~string((string *)local_920);
              std::__cxx11::string::~string((string *)local_900);
              LogMessage::~LogMessage(&local_8c0);
            }
          }
        }
      }
LAB_001539ba:
      operator++((Engine *)&r.submatch[0x10].length_,0);
    }
    if ((((r.submatch[0x10]._15_1_ & 1) == 0) && (0 < FLAGS_max_regexp_failures)) &&
       (FLAGS_max_regexp_failures = FLAGS_max_regexp_failures + -1, FLAGS_max_regexp_failures == 0))
    {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c60,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                 ,0x230);
      poVar4 = LogMessage::stream(&local_c60);
      std::operator<<(poVar4,"Too many regexp failures.");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c60);
    }
    this_local._7_1_ = (bool)(r.submatch[0x10]._15_1_ & 1);
  }
  else if (this->regexp_ == (Regexp *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    LogMessage::LogMessage
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x1f0,2);
    poVar4 = LogMessage::stream(&local_2c8);
    poVar4 = std::operator<<(poVar4,"Skipped backtracking! ");
    CEscape_abi_cxx11_(local_2f8,this->regexp_str_);
    poVar4 = std::operator<<(poVar4,(string *)local_2f8);
    poVar4 = std::operator<<(poVar4," ");
    FormatMode_abi_cxx11_((re2 *)&i,this->flags_);
    std::operator<<(poVar4,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)local_2f8);
    LogMessage::~LogMessage(&local_2c8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TestInstance::RunCase(const StringPiece& text, const StringPiece& context,
                           Prog::Anchor anchor) {
  // Backtracking is the gold standard.
  Result correct;
  RunSearch(kEngineBacktrack, text, context, anchor, &correct);
  if (correct.skipped) {
    if (regexp_ == NULL)
      return true;
    LOG(ERROR) << "Skipped backtracking! " << CEscape(regexp_str_)
               << " " << FormatMode(flags_);
    return false;
  }
  VLOG(1) << "Try: regexp " << CEscape(regexp_str_)
          << " text " << CEscape(text)
          << " (" << FormatKind(kind_)
          << ", " << FormatAnchor(anchor)
          << ", " << FormatMode(flags_)
          << ")";

  // Compare the others.
  bool all_okay = true;
  for (Engine i = kEngineBacktrack+1; i < kEngineMax; i++) {
    if (!(Engines() & (1<<i)))
      continue;

    Result r;
    RunSearch(i, text, context, anchor, &r);
    if (ResultOkay(r, correct)) {
      if (FLAGS_log_okay)
        LogMatch(r.skipped ? "Skipped: " : "Okay: ", i, text, context, anchor);
      continue;
    }

    // We disagree with PCRE on the meaning of some Unicode matches.
    // In particular, we treat non-ASCII UTF-8 as non-word characters.
    // We also treat "empty" character sets like [^\w\W] as being
    // impossible to match, while PCRE apparently excludes some code
    // points (e.g., 0x0080) from both \w and \W.
    if (i == kEnginePCRE && NonASCII(text))
      continue;

    if (!r.untrusted)
      all_okay = false;

    LogMatch(r.untrusted ? "(Untrusted) Mismatch: " : "Mismatch: ", i, text,
             context, anchor);
    if (r.matched != correct.matched) {
      if (r.matched) {
        LOG(INFO) << "   Should not match (but does).";
      } else {
        LOG(INFO) << "   Should match (but does not).";
        continue;
      }
    }
    for (int i = 0; i < 1+num_captures_; i++) {
      if (r.submatch[i].begin() != correct.submatch[i].begin() ||
          r.submatch[i].end() != correct.submatch[i].end()) {
        LOG(INFO) <<
          StringPrintf("   $%d: should be %s is %s",
                       i,
                       FormatCapture(text, correct.submatch[i]).c_str(),
                       FormatCapture(text, r.submatch[i]).c_str());
      } else {
        LOG(INFO) <<
          StringPrintf("   $%d: %s ok", i,
                       FormatCapture(text, r.submatch[i]).c_str());
      }
    }
  }

  if (!all_okay) {
    if (FLAGS_max_regexp_failures > 0 && --FLAGS_max_regexp_failures == 0)
      LOG(QFATAL) << "Too many regexp failures.";
  }

  return all_okay;
}